

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime.cpp
# Opt level: O3

tm * booster::local_time(time_t pt)

{
  tm *ptVar1;
  runtime_error *this;
  tm *in_RDI;
  string local_48;
  time_t local_28;
  
  ptVar1 = localtime_r(&local_28,in_RDI);
  if (ptVar1 != (tm *)0x0) {
    return (tm *)in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"booster::local_time: Failed to convert time to local time","");
  runtime_error::runtime_error(this,&local_48);
  __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

std::tm local_time(time_t pt)
{
	#ifdef BOOSTER_WIN_NATIVE
	// WIN32 Uses TSL
	std::tm *res=::localtime(&pt);
	if(!res)
		throw runtime_error("booster::local_time: Failed to convert time to local time");
	return *res;
	#else
	std::tm tm;
	if(!::localtime_r(&pt,&tm)) {
		throw runtime_error("booster::local_time: Failed to convert time to local time");
	}
	return tm;
	#endif
}